

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall kj::_::NetworkFilter::NetworkFilter(NetworkFilter *this)

{
  initializer_list<unsigned_char> init;
  uint in_R8D;
  ArrayPtr<const_unsigned_char> bits;
  ArrayPtr<const_kj::_::CidrRange> local_a8;
  ArrayPtr<const_unsigned_short> local_98;
  ArrayPtr<const_unsigned_short> local_88;
  CidrRange local_74;
  uchar local_5c [4];
  iterator local_58;
  undefined8 local_50;
  ArrayPtr<const_unsigned_char> local_48;
  CidrRange local_34;
  NetworkFilter *local_10;
  NetworkFilter *this_local;
  
  local_10 = this;
  LowLevelAsyncIoProvider::NetworkFilter::NetworkFilter(&this->super_NetworkFilter);
  (this->super_NetworkFilter)._vptr_NetworkFilter = (_func_int **)&PTR_shouldAllow_00cdd040;
  Vector<kj::_::CidrRange>::Vector(&this->allowCidrs);
  Vector<kj::_::CidrRange>::Vector(&this->denyCidrs);
  this->allowUnix = true;
  this->allowAbstractUnix = true;
  Maybe<kj::_::NetworkFilter_&>::Maybe(&this->next);
  local_5c[0] = '\0';
  local_5c[1] = 0;
  local_5c[2] = 0;
  local_5c[3] = 0;
  local_58 = local_5c;
  local_50 = 4;
  init._M_len = 4;
  init._M_array = local_58;
  ArrayPtr<const_unsigned_char>::ArrayPtr(&local_48,init);
  bits.size_ = 0;
  bits.ptr = (uchar *)local_48.size_;
  CidrRange::inet4(&local_34,(CidrRange *)local_48.ptr,bits,in_R8D);
  Vector<kj::_::CidrRange>::add<kj::_::CidrRange>(&this->allowCidrs,&local_34);
  ArrayPtr<const_unsigned_short>::ArrayPtr(&local_88);
  ArrayPtr<const_unsigned_short>::ArrayPtr(&local_98);
  CidrRange::inet6(&local_74,local_88,local_98,0);
  Vector<kj::_::CidrRange>::add<kj::_::CidrRange>(&this->allowCidrs,&local_74);
  local_a8 = reservedCidrs();
  Vector<kj::_::CidrRange>::addAll<kj::ArrayPtr<kj::_::CidrRange_const>>(&this->denyCidrs,&local_a8)
  ;
  return;
}

Assistant:

NetworkFilter::NetworkFilter()
    : allowUnix(true), allowAbstractUnix(true) {
  allowCidrs.add(CidrRange::inet4({0,0,0,0}, 0));
  allowCidrs.add(CidrRange::inet6({}, {}, 0));
  denyCidrs.addAll(reservedCidrs());
}